

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t HUF_buildCTable_wksp
                 (HUF_CElt *tree,uint *count,U32 maxSymbolValue,U32 maxNbBits,void *workSpace,
                 size_t wkspSize)

{
  ulong uVar1;
  char *pcVar2;
  short *psVar3;
  byte bVar4;
  U16 UVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  uint uVar11;
  uint uVar12;
  long lVar13;
  size_t sVar14;
  byte bVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  ushort uVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  byte *pbVar29;
  uint uVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar37 [32];
  U16 valPerRank [13];
  U16 nbPerRank [13];
  unkbyte10 Stack_158;
  undefined6 local_14e;
  unkbyte10 Stack_148;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined1 uStack_130;
  undefined1 uStack_12f;
  undefined1 uStack_12e;
  undefined1 uStack_12d;
  undefined1 uStack_12c;
  undefined1 uStack_12b;
  undefined1 uStack_12a;
  undefined1 uStack_129;
  undefined1 uStack_128;
  undefined1 uStack_127;
  undefined1 uStack_126;
  undefined1 uStack_125;
  undefined1 uStack_124;
  undefined1 uStack_123;
  undefined1 uStack_122;
  undefined1 uStack_121;
  undefined1 uStack_120;
  undefined1 uStack_11f;
  undefined1 uStack_11e;
  undefined1 uStack_11d;
  undefined1 uStack_11c;
  undefined1 uStack_11b;
  undefined1 uStack_11a;
  undefined1 uStack_119;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar36 [32];
  
  auVar33 = in_ZMM4._0_16_;
  sVar14 = 0xffffffffffffffff;
  if ((((ulong)workSpace & 3) == 0) && (sVar14 = 0xffffffffffffffbe, 0xfff < wkspSize)) {
    uVar22 = 0xb;
    if (maxNbBits != 0) {
      uVar22 = maxNbBits;
    }
    sVar14 = 0xffffffffffffffd2;
    if (maxSymbolValue < 0x100) {
      uVar21 = 0;
      memset(workSpace,0,0x1000);
      local_58 = 0;
      uStack_50 = 0;
      uStack_48 = 0;
      uStack_40 = 0;
      local_78 = 0;
      uStack_70 = 0;
      uStack_68 = 0;
      uStack_60 = 0;
      local_98 = 0;
      uStack_90 = 0;
      uStack_88 = 0;
      uStack_80 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      uStack_a8 = 0;
      uStack_a0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      uStack_c8 = 0;
      uStack_c0 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      uStack_e8 = 0;
      uStack_e0 = 0;
      local_118 = 0;
      uStack_110 = 0;
      uStack_108 = 0;
      uStack_100 = 0;
      local_138._0_1_ = 0;
      local_138._1_1_ = 0;
      local_138._2_1_ = 0;
      local_138._3_1_ = 0;
      uStack_134._0_1_ = 0;
      uStack_134._1_1_ = 0;
      uStack_134._2_1_ = 0;
      uStack_134._3_1_ = 0;
      uStack_130 = 0;
      uStack_12f = 0;
      uStack_12e = 0;
      uStack_12d = 0;
      uStack_12c = 0;
      uStack_12b = 0;
      uStack_12a = 0;
      uStack_129 = 0;
      uStack_128 = 0;
      uStack_127 = 0;
      uStack_126 = 0;
      uStack_125 = 0;
      uStack_124 = 0;
      uStack_123 = 0;
      uStack_122 = 0;
      uStack_121 = 0;
      uStack_120 = 0;
      uStack_11f = 0;
      uStack_11e = 0;
      uStack_11d = 0;
      uStack_11c = 0;
      uStack_11b = 0;
      uStack_11a = 0;
      uStack_119 = 0;
      uVar20 = (ulong)(maxSymbolValue + 1);
      do {
        uVar12 = count[uVar21] + 1;
        if (uVar12 == 0) goto LAB_001112b4;
        uVar23 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> uVar23 == 0; uVar23 = uVar23 - 1) {
          }
        }
        (&local_138)[(ulong)uVar23 * 2] = (&local_138)[(ulong)uVar23 * 2] + 1;
        uVar21 = uVar21 + 1;
      } while (uVar20 != uVar21);
      lVar13 = 0x1d;
      iVar16 = (int)uStack_48;
      do {
        iVar16 = iVar16 + (&local_138)[lVar13 * 2];
        (&local_138)[lVar13 * 2] = iVar16;
        bVar31 = lVar13 != 0;
        lVar13 = lVar13 + -1;
      } while (bVar31);
      lVar13 = 0;
      do {
        (&uStack_134)[lVar13 * 2] = (&local_138)[lVar13 * 2];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x20);
      uVar21 = 0;
      do {
        uVar12 = count[uVar21];
        uVar23 = uVar12 + 1;
        if (uVar23 == 0) {
LAB_001112b4:
          __assert_fail("val != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x5a1,"unsigned int BIT_highbit32(U32)");
        }
        uVar24 = 0x1f;
        if (uVar23 != 0) {
          for (; uVar23 >> uVar24 == 0; uVar24 = uVar24 - 1) {
          }
        }
        uVar27 = (ulong)((uVar24 ^ 0x1fffffe0) * 8 + 0x108);
        uVar23 = *(uint *)((long)&local_138 + uVar27);
        uVar24 = *(uint *)((long)&uStack_134 + uVar27);
        uVar19 = (ulong)uVar24;
        *(uint *)((long)&uStack_134 + uVar27) = uVar24 + 1;
        uVar27 = uVar19;
        if (uVar23 < uVar24) {
          do {
            uVar27 = uVar27 - 1;
            if (uVar12 <= *(uint *)((long)workSpace + (uVar27 & 0xffffffff) * 8 + 8))
            goto LAB_00110c56;
            *(undefined8 *)((long)workSpace + uVar27 * 8 + 0x10) =
                 *(undefined8 *)((long)workSpace + (uVar27 & 0xffffffff) * 8 + 8);
            uVar24 = (int)uVar19 - 1;
            uVar19 = (ulong)uVar24;
          } while (uVar23 < uVar24);
          uVar19 = (ulong)uVar23;
        }
LAB_00110c56:
        *(uint *)((long)workSpace + uVar19 * 8 + 8) = uVar12;
        *(char *)((long)workSpace + uVar19 * 8 + 0xe) = (char)uVar21;
        uVar21 = uVar21 + 1;
      } while (uVar21 != uVar20);
      uVar12 = maxSymbolValue + 0x100;
      do {
        uVar23 = uVar12;
        uVar21 = (ulong)(uVar23 - 0x100);
        uVar12 = uVar23 - 1;
      } while (*(int *)((long)workSpace + uVar21 * 8 + 8) == 0);
      lVar13 = (long)(int)(uVar23 - 0x100);
      *(int *)((long)workSpace + 0x808) =
           *(int *)((long)workSpace + lVar13 * 8) + *(int *)((long)workSpace + lVar13 * 8 + 8);
      *(undefined2 *)((long)workSpace + lVar13 * 8 + 4) = 0x100;
      *(undefined2 *)((long)workSpace + lVar13 * 8 + 0xc) = 0x100;
      uVar27 = (ulong)uVar12;
      uVar24 = uVar23 - 0x102;
      if (uVar12 < 0x101) {
        *(undefined4 *)workSpace = 0x80000000;
      }
      else {
        lVar13 = uVar27 - 0x101;
        auVar35._8_8_ = lVar13;
        auVar35._0_8_ = lVar13;
        auVar36._16_8_ = lVar13;
        auVar36._0_16_ = auVar35;
        auVar36._24_8_ = lVar13;
        uVar19 = 0;
        auVar8 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar9 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar32._8_8_ = 0x8000000000000000;
        auVar32._0_8_ = 0x8000000000000000;
        auVar33 = vpcmpeqd_avx(auVar33,auVar33);
        auVar34._8_8_ = 0x8000000000000000;
        auVar34._0_8_ = 0x8000000000000000;
        auVar34._16_8_ = 0x8000000000000000;
        auVar34._24_8_ = 0x8000000000000000;
        do {
          auVar37._8_8_ = uVar19;
          auVar37._0_8_ = uVar19;
          auVar37._16_8_ = uVar19;
          auVar37._24_8_ = uVar19;
          auVar10 = vpor_avx2(auVar37,auVar9);
          auVar6 = vpcmpgtq_avx(auVar10._0_16_ ^ auVar32,auVar35 ^ auVar32);
          auVar6 = vpackssdw_avx(auVar6,auVar6);
          auVar6 = vpackssdw_avx(auVar6 ^ auVar33,auVar6 ^ auVar33);
          if ((auVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined4 *)((long)workSpace + uVar19 * 8 + 0x810) = 0x40000000;
          }
          auVar6 = vpcmpgtq_avx(auVar10._0_16_ ^ auVar32,auVar35 ^ auVar32);
          auVar6 = vpackssdw_avx(auVar6,auVar6);
          auVar6 = vpackssdw_avx(auVar6 ^ auVar33,auVar6 ^ auVar33);
          if ((auVar6 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined4 *)((long)workSpace + uVar19 * 8 + 0x818) = 0x40000000;
          }
          auVar7 = vpcmpgtq_avx2(auVar10 ^ auVar34,auVar36 ^ auVar34);
          auVar10 = vpackssdw_avx2(auVar7,auVar8);
          auVar6 = auVar10._16_16_ ^ auVar33;
          auVar6 = vpackssdw_avx(auVar6,auVar6);
          if ((auVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined4 *)((long)workSpace + uVar19 * 8 + 0x820) = 0x40000000;
          }
          auVar10 = vpackssdw_avx2(auVar7,auVar8);
          auVar6 = auVar10._16_16_ ^ auVar33;
          auVar6 = vpackssdw_avx(auVar6,auVar6);
          if ((auVar6 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined4 *)((long)workSpace + uVar19 * 8 + 0x828) = 0x40000000;
          }
          auVar10 = vpor_avx2(auVar37,auVar8);
          auVar6 = vpcmpgtq_avx(auVar10._0_16_ ^ auVar32,auVar35 ^ auVar32);
          auVar6 = vpackssdw_avx(auVar6,auVar6);
          auVar6 = vpackssdw_avx(auVar6 ^ auVar33,auVar6 ^ auVar33);
          if ((auVar6 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined4 *)((long)workSpace + uVar19 * 8 + 0x830) = 0x40000000;
          }
          auVar6 = vpcmpgtq_avx(auVar10._0_16_ ^ auVar32,auVar35 ^ auVar32);
          auVar6 = vpackssdw_avx(auVar6,auVar6);
          auVar6 = vpackssdw_avx(auVar6 ^ auVar33,auVar6 ^ auVar33);
          if ((auVar6 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined4 *)((long)workSpace + uVar19 * 8 + 0x838) = 0x40000000;
          }
          auVar37 = vpcmpgtq_avx2(auVar10 ^ auVar34,auVar36 ^ auVar34);
          auVar10 = vpackssdw_avx2(auVar8,auVar37);
          auVar6 = auVar10._16_16_ ^ auVar33;
          auVar6 = vpackssdw_avx(auVar6,auVar6);
          if ((auVar6 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined4 *)((long)workSpace + uVar19 * 8 + 0x840) = 0x40000000;
          }
          auVar10 = vpshufhw_avx2(auVar37,0x84);
          auVar6 = auVar10._16_16_ ^ auVar33;
          auVar6 = vpackssdw_avx(auVar6,auVar6);
          if ((auVar6 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined4 *)((long)workSpace + uVar19 * 8 + 0x848) = 0x40000000;
          }
          uVar19 = uVar19 + 8;
        } while ((uVar27 - 0xf9 & 0xfffffffffffffff8) != uVar19);
        *(undefined4 *)workSpace = 0x80000000;
        if (0x100 < uVar12) {
          uVar18 = 0x100;
          uVar25 = 0x101;
          do {
            uVar17 = *(uint *)((long)workSpace + (long)(int)uVar24 * 8 + 8);
            uVar26 = *(uint *)((long)workSpace + (long)(int)uVar18 * 8 + 8);
            uVar30 = (uVar18 + 1) - (uint)(uVar17 < uVar26);
            uVar11 = uVar18;
            if (uVar17 < uVar26) {
              uVar11 = uVar24;
            }
            uVar18 = (uint)(uVar17 < uVar26);
            uVar28 = uVar24 - uVar18;
            uVar17 = *(uint *)((long)workSpace + (long)(int)uVar28 * 8 + 8);
            uVar26 = *(uint *)((long)workSpace + (long)(int)uVar30 * 8 + 8);
            uVar24 = (uVar24 - uVar18) - (uint)(uVar17 < uVar26);
            uVar18 = (uVar30 + 1) - (uint)(uVar17 < uVar26);
            if (uVar26 <= uVar17) {
              uVar28 = uVar30;
            }
            *(int *)((long)workSpace + (ulong)uVar25 * 8 + 8) =
                 *(int *)((long)workSpace + (ulong)uVar28 * 8 + 8) +
                 *(int *)((long)workSpace + (ulong)uVar11 * 8 + 8);
            *(ushort *)((long)workSpace + (ulong)uVar28 * 8 + 0xc) = uVar25;
            *(ushort *)((long)workSpace + (ulong)uVar11 * 8 + 0xc) = uVar25;
            uVar25 = uVar25 + 1;
          } while (uVar25 <= uVar12);
        }
      }
      *(undefined1 *)((long)workSpace + uVar27 * 8 + 0xf) = 0;
      if (uVar23 - 0x102 < 0xffffff00) {
        uVar27 = (ulong)(uVar23 - 2);
        do {
          uVar27 = uVar27 - 1;
          *(char *)((long)workSpace + uVar27 * 8 + 0x17) =
               *(char *)((long)workSpace +
                        (ulong)*(ushort *)((long)workSpace + uVar27 * 8 + 0x14) * 8 + 0xf) + '\x01';
        } while ((uVar27 & 0xffffff00) != 0);
      }
      uVar27 = 0xffffffffffffffff;
      do {
        *(char *)((long)workSpace + uVar27 * 8 + 0x17) =
             *(char *)((long)workSpace +
                      (ulong)*(ushort *)((long)workSpace + uVar27 * 8 + 0x14) * 8 + 0xf) + '\x01';
        uVar27 = uVar27 + 1;
      } while (uVar27 < uVar21);
      bVar4 = *(byte *)((long)workSpace + uVar21 * 8 + 0xf);
      uVar24 = (uint)bVar4;
      uVar12 = (uint)bVar4;
      if (uVar22 <= uVar24 && uVar24 - uVar22 != 0) {
        bVar15 = (byte)(uVar24 - uVar22);
        pbVar29 = (byte *)((long)workSpace + uVar21 * 8 + 0xf);
        iVar16 = 0;
        uVar12 = uVar23 - 0x101;
        uVar23 = uVar24;
        do {
          uVar18 = uVar12;
          iVar16 = (-1 << (bVar4 - (char)uVar23 & 0x1f)) + iVar16 + (1 << (bVar15 & 0x1f));
          *pbVar29 = (byte)uVar22;
          pbVar29 = (byte *)((long)workSpace + (ulong)uVar18 * 8 + 0xf);
          uVar23 = (uint)*pbVar29;
          uVar12 = uVar18 - 1;
        } while (uVar22 < *pbVar29);
        uVar27 = (ulong)(uVar18 + 1);
        do {
          uVar12 = (int)uVar27 - 1;
          uVar27 = (ulong)uVar12;
        } while (uVar22 == *(byte *)((long)workSpace + uVar27 * 8 + 0xf));
        uVar23 = iVar16 >> (bVar15 & 0x1f);
        local_118 = 0xf0f0f0f0f0f0f0f0;
        uStack_110 = 0xf0f0f0f0f0f0f0f0;
        uStack_108 = 0xf0f0f0f0f0f0f0f0;
        local_138._0_1_ = 0xf0;
        local_138._1_1_ = 0xf0;
        local_138._2_1_ = 0xf0;
        local_138._3_1_ = 0xf0;
        uStack_134._0_1_ = 0xf0;
        uStack_134._1_1_ = 0xf0;
        uStack_134._2_1_ = 0xf0;
        uStack_134._3_1_ = 0xf0;
        uStack_130 = 0xf0;
        uStack_12f = 0xf0;
        uStack_12e = 0xf0;
        uStack_12d = 0xf0;
        uStack_12c = 0xf0;
        uStack_12b = 0xf0;
        uStack_12a = 0xf0;
        uStack_129 = 0xf0;
        uStack_128 = 0xf0;
        uStack_127 = 0xf0;
        uStack_126 = 0xf0;
        uStack_125 = 0xf0;
        uStack_124 = 0xf0;
        uStack_123 = 0xf0;
        uStack_122 = 0xf0;
        uStack_121 = 0xf0;
        uStack_120 = 0xf0;
        uStack_11f = 0xf0;
        uStack_11e = 0xf0;
        uStack_11d = 0xf0;
        uStack_11c = 0xf0;
        uStack_11b = 0xf0;
        uStack_11a = 0xf0;
        uStack_119 = 0xf0;
        if (-1 < (int)uVar12) {
          pbVar29 = (byte *)((long)workSpace + uVar27 * 8 + 0xf);
          uVar19 = uVar27;
          uVar12 = uVar22;
          do {
            iVar16 = (int)uVar19;
            if (*pbVar29 < uVar12) {
              uVar12 = (uint)*pbVar29;
              (&local_138)[uVar22 - uVar12] = iVar16;
            }
            uVar19 = uVar19 - 1;
            pbVar29 = pbVar29 + -8;
          } while (0 < iVar16);
        }
        for (; 0 < (int)uVar23; uVar23 = (-1 << ((byte)uVar17 & 0x1f)) + uVar23) {
          uVar12 = 0x1f;
          if (uVar23 != 0) {
            for (; uVar23 >> uVar12 == 0; uVar12 = uVar12 - 1) {
            }
          }
          if ((uVar12 ^ 0x1f) != 0x1f) {
            uVar19 = (ulong)(0x20 - (uVar12 ^ 0x1f));
            do {
              uVar1 = uVar19 - 1;
              if (((ulong)(uint)(&local_138)[uVar19] != 0xf0f0f0f0) &&
                 (((&local_138)[uVar1 & 0xffffffff] == 0xf0f0f0f0 ||
                  (*(uint *)((long)workSpace + (ulong)(uint)(&local_138)[uVar19] * 8 + 8) <=
                   (uint)(*(int *)((long)workSpace +
                                  (ulong)(uint)(&local_138)[uVar1 & 0xffffffff] * 8 + 8) * 2))))) {
                if (0xc < uVar19) goto LAB_00111110;
                goto LAB_001110ee;
              }
              uVar19 = uVar1;
            } while ((uVar1 & 0xfffffffe) != 0);
          }
          uVar19 = 1;
LAB_001110ee:
          do {
            if ((&local_138)[uVar19] != -0xf0f0f10) goto LAB_00111110;
            uVar19 = uVar19 + 1;
          } while (uVar19 != 0xd);
          uVar19 = 0xd;
LAB_00111110:
          uVar17 = (int)uVar19 - 1;
          uVar12 = (&local_138)[uVar19 & 0xffffffff];
          uVar18 = (&local_138)[uVar17];
          if ((&local_138)[uVar17] == 0xf0f0f0f0) {
            uVar18 = uVar12;
          }
          (&local_138)[uVar17] = uVar18;
          pcVar2 = (char *)((long)workSpace + (ulong)uVar12 * 8 + 0xf);
          *pcVar2 = *pcVar2 + '\x01';
          if ((ulong)uVar12 == 0) {
            uVar12 = 0xf0f0f0f0;
          }
          else {
            uVar12 = uVar12 - 1;
            if (uVar22 - (int)uVar19 != (uint)*(byte *)((long)workSpace + (ulong)uVar12 * 8 + 0xf))
            {
              uVar12 = 0xf0f0f0f0;
            }
          }
          (&local_138)[uVar19 & 0xffffffff] = uVar12;
        }
        uVar12 = uVar22;
        if ((int)uVar23 < 0) {
          uVar19 = (ulong)CONCAT13(uStack_134._3_1_,
                                   CONCAT12(uStack_134._2_1_,
                                            CONCAT11(uStack_134._1_1_,(undefined1)uStack_134)));
          do {
            uVar18 = (uint)uVar19;
            uVar17 = uVar18 + 0xf0f0f10;
            uVar26 = 0;
            while (uVar18 = uVar18 + 1, uVar17 != uVar26) {
              pcVar2 = (char *)((long)workSpace + (ulong)uVar18 * 8 + 0xf);
              *pcVar2 = *pcVar2 + -1;
              uVar26 = uVar26 - 1;
              if (uVar23 == uVar26) goto LAB_00111184;
            }
            iVar16 = uVar23 - uVar26;
            uVar19 = uVar27;
            do {
              uVar27 = uVar19;
              uVar19 = (ulong)((int)uVar27 - 1);
            } while (uVar22 == *(byte *)((long)workSpace + uVar27 * 8 + 0xf));
            uVar19 = (ulong)((int)uVar27 + 1);
            pcVar2 = (char *)((long)workSpace + uVar19 * 8 + 0xf);
            *pcVar2 = *pcVar2 + -1;
            uVar23 = iVar16 + 1;
          } while (iVar16 < -1);
        }
      }
LAB_00111184:
      uStack_128 = 0;
      uStack_127 = 0;
      uStack_126 = 0;
      uStack_125 = 0;
      uStack_124 = 0;
      uStack_123 = 0;
      uStack_122 = 0;
      uStack_121 = 0;
      uStack_120 = 0;
      uStack_11f = 0;
      local_138._0_1_ = 0;
      local_138._1_1_ = 0;
      local_138._2_1_ = 0;
      local_138._3_1_ = 0;
      uStack_134._0_1_ = 0;
      uStack_134._1_1_ = 0;
      uStack_134._2_1_ = 0;
      uStack_134._3_1_ = 0;
      uStack_130 = 0;
      uStack_12f = 0;
      uStack_12e = 0;
      uStack_12d = 0;
      uStack_12c = 0;
      uStack_12b = 0;
      uStack_12a = 0;
      uStack_129 = 0;
      Stack_148 = SUB1610((undefined1  [16])0x0,6);
      Stack_158 = SUB1610((undefined1  [16])0x0,0);
      local_14e = 0;
      if (uVar12 < 0xd) {
        uVar27 = 0xffffffffffffffff;
        do {
          psVar3 = (short *)((long)&local_138 +
                            (ulong)*(byte *)((long)workSpace + uVar27 * 8 + 0x17) * 2);
          *psVar3 = *psVar3 + 1;
          uVar27 = uVar27 + 1;
        } while (uVar27 < uVar21);
        if (uVar12 != 0) {
          if (uVar22 < uVar24) {
            uVar24 = uVar22;
          }
          uVar21 = (ulong)(uVar24 * 2);
          uVar25 = 0;
          do {
            *(ushort *)((long)&Stack_158 + uVar21) = uVar25;
            uVar25 = (ushort)(uVar25 + *(short *)((long)&local_138 + uVar21)) >> 1;
            uVar21 = uVar21 - 2;
          } while ((int)uVar21 != 0);
        }
        uVar21 = 0;
        do {
          tree[*(byte *)((long)workSpace + uVar21 * 8 + 0xe)].nbBits =
               *(BYTE *)((long)workSpace + uVar21 * 8 + 0xf);
          uVar21 = uVar21 + 1;
        } while (uVar20 != uVar21);
        uVar21 = 0;
        do {
          UVar5 = *(U16 *)((long)&Stack_158 + (ulong)tree[uVar21].nbBits * 2);
          *(U16 *)((long)&Stack_158 + (ulong)tree[uVar21].nbBits * 2) = UVar5 + 1;
          tree[uVar21].val = UVar5;
          uVar21 = uVar21 + 1;
        } while (uVar20 != uVar21);
      }
      sVar14 = 0xffffffffffffffff;
      if (uVar12 < 0xd) {
        sVar14 = (ulong)uVar12;
      }
    }
  }
  return sVar14;
}

Assistant:

size_t HUF_buildCTable_wksp (HUF_CElt* tree, const unsigned* count, U32 maxSymbolValue, U32 maxNbBits, void* workSpace, size_t wkspSize)
{
    nodeElt* const huffNode0 = (nodeElt*)workSpace;
    nodeElt* const huffNode = huffNode0+1;
    U32 n, nonNullRank;
    int lowS, lowN;
    U16 nodeNb = STARTNODE;
    U32 nodeRoot;

    /* safety checks */
    if (((size_t)workSpace & 3) != 0) return ERROR(GENERIC);  /* must be aligned on 4-bytes boundaries */
    if (wkspSize < sizeof(huffNodeTable)) return ERROR(workSpace_tooSmall);
    if (maxNbBits == 0) maxNbBits = HUF_TABLELOG_DEFAULT;
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    memset(huffNode0, 0, sizeof(huffNodeTable));

    /* sort, decreasing order */
    HUF_sort(huffNode, count, maxSymbolValue);

    /* init for parents */
    nonNullRank = maxSymbolValue;
    while(huffNode[nonNullRank].count == 0) nonNullRank--;
    lowS = nonNullRank; nodeRoot = nodeNb + lowS - 1; lowN = nodeNb;
    huffNode[nodeNb].count = huffNode[lowS].count + huffNode[lowS-1].count;
    huffNode[lowS].parent = huffNode[lowS-1].parent = nodeNb;
    nodeNb++; lowS-=2;
    for (n=nodeNb; n<=nodeRoot; n++) huffNode[n].count = (U32)(1U<<30);
    huffNode0[0].count = (U32)(1U<<31);  /* fake entry, strong barrier */

    /* create parents */
    while (nodeNb <= nodeRoot) {
        U32 n1 = (huffNode[lowS].count < huffNode[lowN].count) ? lowS-- : lowN++;
        U32 n2 = (huffNode[lowS].count < huffNode[lowN].count) ? lowS-- : lowN++;
        huffNode[nodeNb].count = huffNode[n1].count + huffNode[n2].count;
        huffNode[n1].parent = huffNode[n2].parent = nodeNb;
        nodeNb++;
    }

    /* distribute weights (unlimited tree height) */
    huffNode[nodeRoot].nbBits = 0;
    for (n=nodeRoot-1; n>=STARTNODE; n--)
        huffNode[n].nbBits = huffNode[ huffNode[n].parent ].nbBits + 1;
    for (n=0; n<=nonNullRank; n++)
        huffNode[n].nbBits = huffNode[ huffNode[n].parent ].nbBits + 1;

    /* enforce maxTableLog */
    maxNbBits = HUF_setMaxHeight(huffNode, nonNullRank, maxNbBits);

    /* fill result into tree (val, nbBits) */
    {   U16 nbPerRank[HUF_TABLELOG_MAX+1] = {0};
        U16 valPerRank[HUF_TABLELOG_MAX+1] = {0};
        if (maxNbBits > HUF_TABLELOG_MAX) return ERROR(GENERIC);   /* check fit into table */
        for (n=0; n<=nonNullRank; n++)
            nbPerRank[huffNode[n].nbBits]++;
        /* determine stating value per rank */
        {   U16 min = 0;
            for (n=maxNbBits; n>0; n--) {
                valPerRank[n] = min;      /* get starting value within each rank */
                min += nbPerRank[n];
                min >>= 1;
        }   }
        for (n=0; n<=maxSymbolValue; n++)
            tree[huffNode[n].byte].nbBits = huffNode[n].nbBits;   /* push nbBits per symbol, symbol order */
        for (n=0; n<=maxSymbolValue; n++)
            tree[n].val = valPerRank[tree[n].nbBits]++;   /* assign value within rank, symbol order */
    }

    return maxNbBits;
}